

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void array_container_union
               (array_container_t *array_1,array_container_t *array_2,array_container_t *out)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int min;
  
  iVar1 = array_1->cardinality;
  iVar2 = array_2->cardinality;
  min = iVar2 + iVar1;
  if (out->capacity < min) {
    array_container_grow(out,min,false);
  }
  sVar3 = fast_union_uint16(array_1->array,(long)iVar1,array_2->array,(long)iVar2,out->array);
  out->cardinality = (int32_t)sVar3;
  return;
}

Assistant:

void array_container_union(const array_container_t *array_1,
                           const array_container_t *array_2,
                           array_container_t *out) {
    const int32_t card_1 = array_1->cardinality, card_2 = array_2->cardinality;
    const int32_t max_cardinality = card_1 + card_2;

    if (out->capacity < max_cardinality) {
        array_container_grow(out, max_cardinality, false);
    }
    out->cardinality = (int32_t)fast_union_uint16(
        array_1->array, card_1, array_2->array, card_2, out->array);
}